

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpElementP<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar4;
  undefined4 *puVar5;
  ulong uVar6;
  undefined6 in_register_0000003a;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetPropertyIdFromCacheId(dumpFunction,(uint)data->inlineCacheIndex);
  pPVar4 = ScriptContext::GetPropertyName(this,propertyId);
  iVar2 = (int)CONCAT62(in_register_0000003a,op);
  uVar6 = (ulong)(iVar2 - 0x112U);
  if (iVar2 - 0x112U < 0x22) {
    if ((0x2000005UL >> (uVar6 & 0x3f) & 1) != 0) goto switchD_0074fc8f_caseD_74;
    if ((0x300000000U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_0074fd3d;
    if (uVar6 == 0x1f) goto LAB_0074fd9b;
  }
  switch(iVar2) {
  case 0x62:
  case 100:
    Output::Print(L" R%d = %s #%d",(ulong)data->Value,pPVar4 + 1,(ulong)data->inlineCacheIndex);
    return;
  case 99:
  case 0x65:
    Output::Print(L" R%d = %s #%d",(ulong)data->Value,pPVar4 + 1,(ulong)data->inlineCacheIndex);
    break;
  default:
    switch(iVar2) {
    case 0x74:
    case 0x7c:
switchD_0074fc8f_caseD_74:
      Output::Print(L" %s = R%d #%d",pPVar4 + 1,(ulong)data->Value,(ulong)data->inlineCacheIndex);
      return;
    case 0x75:
    case 0x7d:
      Output::Print(L" %s = R%d #%d",pPVar4 + 1,(ulong)data->Value,(ulong)data->inlineCacheIndex);
      break;
    default:
      if (iVar2 - 0x88U < 2) {
LAB_0074fd3d:
        Output::Print(L" %s = R%d, R%d #%d",pPVar4 + 1,(ulong)data->Value,1,
                      (ulong)data->inlineCacheIndex);
        return;
      }
      if (iVar2 == 0x84) {
LAB_0074fd9b:
        Output::Print(L" R%d = %s, R%d #%d",(ulong)data->Value,pPVar4 + 1,1,
                      (ulong)data->inlineCacheIndex);
        return;
      }
    case 0x76:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
    case 0x7b:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x401,"(false)","Unknown OpCode for OpLayoutElementP");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      return;
    }
  }
  DumpProfileId((uint)data->inlineCacheIndex);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementP(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyId propertyId = dumpFunction->GetPropertyIdFromCacheId(data->inlineCacheIndex);
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propertyId);
        switch (op)
        {
            case OpCode::ScopedLdFldForTypeOf:
            case OpCode::ScopedLdFld:
                Output::Print(_u(" R%d = %s, R%d #%d"), data->Value, pPropertyName->GetBuffer(),
                    Js::FunctionBody::RootObjectRegSlot, data->inlineCacheIndex);
                break;

            case OpCode::ScopedStFld:
            case OpCode::ConsoleScopedStFld:
            case OpCode::ScopedStFldStrict:
            case OpCode::ConsoleScopedStFldStrict:
                Output::Print(_u(" %s = R%d, R%d #%d"), pPropertyName->GetBuffer(), data->Value,
                    Js::FunctionBody::RootObjectRegSlot, data->inlineCacheIndex);
                break;

            case OpCode::LdLocalFld:
            case OpCode::LdLocalFld_ReuseLoc:
                Output::Print(_u(" R%d = %s #%d"), data->Value, pPropertyName->GetBuffer(), data->inlineCacheIndex);
                break;

            case OpCode::ProfiledLdLocalFld:
            case OpCode::ProfiledLdLocalFld_ReuseLoc:
                Output::Print(_u(" R%d = %s #%d"), data->Value, pPropertyName->GetBuffer(), data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;

            case OpCode::StLocalFld:
            case OpCode::InitLocalFld:
            case OpCode::InitLocalLetFld:
            case OpCode::InitUndeclLocalLetFld:
            case OpCode::InitUndeclLocalConstFld:
                Output::Print(_u(" %s = R%d #%d"), pPropertyName->GetBuffer(), data->Value, data->inlineCacheIndex);
                break;

            case OpCode::ProfiledStLocalFld:
            case OpCode::ProfiledInitLocalFld:
                Output::Print(_u(" %s = R%d #%d"), pPropertyName->GetBuffer(), data->Value, data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;

            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementP");
                break;
            }
        }
    }